

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O0

bool __thiscall bssl::is_hex_component(bssl *this,Span<const_unsigned_char> in)

{
  int iVar1;
  size_t sVar2;
  uchar *puVar3;
  iterator puVar4;
  uint8_t b;
  iterator __end1;
  iterator __begin1;
  Span<const_unsigned_char> *local_28;
  Span<const_unsigned_char> *__range1;
  Span<const_unsigned_char> in_local;
  
  in_local.data_ = in.data_;
  __range1 = (Span<const_unsigned_char> *)this;
  sVar2 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&__range1);
  if (((1 < sVar2) &&
      (puVar3 = Span<const_unsigned_char>::operator[]((Span<const_unsigned_char> *)&__range1,0),
      *puVar3 == '0')) &&
     ((puVar3 = Span<const_unsigned_char>::operator[]((Span<const_unsigned_char> *)&__range1,1),
      *puVar3 == 'x' ||
      (puVar3 = Span<const_unsigned_char>::operator[]((Span<const_unsigned_char> *)&__range1,1),
      *puVar3 == 'X')))) {
    ___begin1 = Span<const_unsigned_char>::subspan
                          ((Span<const_unsigned_char> *)&__range1,2,0xffffffffffffffff);
    local_28 = (Span<const_unsigned_char> *)&__begin1;
    __end1 = Span<const_unsigned_char>::begin(local_28);
    puVar4 = Span<const_unsigned_char>::end(local_28);
    while( true ) {
      if (__end1 == puVar4) {
        return true;
      }
      iVar1 = OPENSSL_isxdigit((uint)*__end1);
      if (iVar1 == 0) break;
      __end1 = __end1 + 1;
    }
    return false;
  }
  return false;
}

Assistant:

static bool is_hex_component(Span<const uint8_t> in) {
  if (in.size() < 2 || in[0] != '0' || (in[1] != 'x' && in[1] != 'X')) {
    return false;
  }
  for (uint8_t b : in.subspan(2)) {
    if (!OPENSSL_isxdigit(b)) {
      return false;
    }
  }
  return true;
}